

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.h
# Opt level: O1

avl_node_t * avl_rotate_RR(avl_node_t *parent)

{
  avl_node_t *paVar1;
  avl_node *paVar2;
  int h1;
  uint uVar3;
  uint uVar4;
  
  paVar1 = parent->right;
  paVar2 = paVar1->left;
  parent->right = paVar2;
  paVar1->left = parent;
  uVar3 = 0;
  uVar4 = 0;
  if (parent->left != (avl_node *)0x0) {
    uVar4 = parent->left->height;
  }
  if (paVar2 != (avl_node *)0x0) {
    uVar3 = paVar2->height;
  }
  if ((int)uVar3 < (int)uVar4) {
    uVar3 = uVar4;
  }
  uVar3 = uVar3 + 1;
  parent->height = uVar3;
  if (paVar1->right == (avl_node *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = paVar1->right->height;
  }
  if ((int)uVar4 < (int)uVar3) {
    uVar4 = uVar3;
  }
  paVar1->height = uVar4 + 1;
  return paVar1;
}

Assistant:

static avl_node_t*
avl_rotate_RR(avl_node_t *parent)
{
    avl_node_t *child = parent->right;
    parent->right = child->left;
    child->left = parent;
    avl_update_height(parent);
    avl_update_height(child);
    return child;
}